

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O0

void __thiscall
TEST_TestMemoryAllocatorTest_SetCurrentMallocAllocator_Test::testBody
          (TEST_TestMemoryAllocatorTest_SetCurrentMallocAllocator_Test *this)

{
  TestMemoryAllocator *pTVar1;
  UtestShell *pUVar2;
  TestMemoryAllocator *pTVar3;
  TestTerminator *pTVar4;
  TEST_TestMemoryAllocatorTest_SetCurrentMallocAllocator_Test *this_local;
  
  pTVar1 = (TestMemoryAllocator *)
           operator_new(0x28,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
                        ,0x50);
  TestMemoryAllocator::TestMemoryAllocator(pTVar1,"malloc_allocator","alloc","free");
  (this->super_TEST_GROUP_CppUTestGroupTestMemoryAllocatorTest).allocator = pTVar1;
  setCurrentMallocAllocator((this->super_TEST_GROUP_CppUTestGroupTestMemoryAllocatorTest).allocator)
  ;
  pUVar2 = UtestShell::getCurrent();
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTestMemoryAllocatorTest).allocator;
  pTVar3 = getCurrentMallocAllocator();
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[0x13])
            (pUVar2,pTVar1,pTVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
             ,0x52,pTVar4);
  setCurrentMallocAllocatorToDefault();
  pUVar2 = UtestShell::getCurrent();
  pTVar1 = defaultMallocAllocator();
  pTVar3 = getCurrentMallocAllocator();
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[0x13])
            (pUVar2,pTVar1,pTVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
             ,0x54,pTVar4);
  return;
}

Assistant:

TEST(TestMemoryAllocatorTest, SetCurrentMallocAllocator)
{
    allocator = new TestMemoryAllocator("malloc_allocator");
    setCurrentMallocAllocator(allocator);
    POINTERS_EQUAL(allocator, getCurrentMallocAllocator());
    setCurrentMallocAllocatorToDefault();
    POINTERS_EQUAL(defaultMallocAllocator(), getCurrentMallocAllocator());
}